

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

Array<char> * __thiscall asl::Array<char>::append(Array<char> *this,Array<char> *b)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int m;
  
  iVar1 = *(int *)(this->_a + -0x10);
  m = *(int *)(b->_a + -0x10) + iVar1;
  reserve(this,m);
  *(int *)(this->_a + -0x10) = m;
  pcVar3 = b->_a;
  if (0 < *(int *)(pcVar3 + -0x10)) {
    lVar2 = 0;
    do {
      this->_a[lVar2 + iVar1] = pcVar3[lVar2];
      lVar2 = lVar2 + 1;
      pcVar3 = b->_a;
    } while (lVar2 < *(int *)(pcVar3 + -0x10));
  }
  return this;
}

Assistant:

Array& append(const Array& b)
	{
		int n=length();
		resize(length()+b.length());
		for (int i=0; i<b.length(); i++)
			_a[n+i] = b[i];
		return *this;
	}